

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O0

Test * __thiscall
testing::internal::TestFactoryImpl<bioparser::test::BioparserFastqTest_CompressedFormatError_Test>::
CreateTest(TestFactoryImpl<bioparser::test::BioparserFastqTest_CompressedFormatError_Test> *this)

{
  Test *this_00;
  TestFactoryImpl<bioparser::test::BioparserFastqTest_CompressedFormatError_Test> *this_local;
  
  this_00 = (Test *)operator_new(0x30);
  bioparser::test::BioparserFastqTest_CompressedFormatError_Test::
  BioparserFastqTest_CompressedFormatError_Test
            ((BioparserFastqTest_CompressedFormatError_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override { return new TestClass; }